

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zuker.cpp
# Opt level: O3

void __thiscall Zuker::calculate_E(Zuker *this)

{
  undefined8 *puVar1;
  int iVar2;
  int pa;
  int pb;
  int pna;
  int ppb;
  uint uVar3;
  int n_codon_an;
  int n_codon_bp;
  int xi;
  int yj;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  undefined1 auVar8 [16];
  int i;
  uint uVar9;
  pointer piVar10;
  uint uVar11;
  int la;
  int lb;
  void *pvVar12;
  long lVar13;
  void *__s;
  void *pvVar14;
  void *pvVar15;
  ulong uVar16;
  ostream *poVar17;
  ulong uVar18;
  uint uVar19;
  int l;
  int iVar20;
  int iVar21;
  ulong uVar22;
  uint i_00;
  int iVar23;
  ulong uVar24;
  long lVar25;
  int a;
  int iVar26;
  int iVar27;
  long lVar28;
  int x;
  long lVar29;
  int y;
  long lVar30;
  ulong uVar31;
  ulong local_200;
  ulong local_1f8;
  uint local_1bc;
  long local_168;
  long local_160;
  string dn;
  string cp;
  string bp;
  string an;
  
  an._M_dataplus._M_p = (pointer)&an.field_2;
  an._M_string_length = 0;
  an.field_2._M_local_buf[0] = '\0';
  bp._M_dataplus._M_p = (pointer)&bp.field_2;
  bp._M_string_length = 0;
  bp.field_2._M_local_buf[0] = '\0';
  cp._M_dataplus._M_p = (pointer)&cp.field_2;
  cp._M_string_length = 0;
  cp.field_2._M_local_buf[0] = '\0';
  dn._M_dataplus._M_p = (pointer)&dn.field_2;
  dn._M_string_length = 0;
  dn.field_2._M_local_buf[0] = '\0';
  iVar2 = this->n;
  pvVar12 = operator_new(0x1800);
  uVar9 = iVar2 * 3;
  lVar13 = 0;
  do {
    puVar1 = (undefined8 *)((long)pvVar12 + lVar13 * 4);
    *puVar1 = 0x98968000989680;
    puVar1[1] = 0x98968000989680;
    lVar13 = lVar13 + 4;
  } while (lVar13 != 0x600);
  __s = operator_new(0x1800);
  memset(__s,0,0x1800);
  pvVar14 = operator_new(0x180);
  lVar13 = 0;
  do {
    puVar1 = (undefined8 *)((long)pvVar14 + lVar13 * 4);
    *puVar1 = 0x98968000989680;
    puVar1[1] = 0x98968000989680;
    lVar13 = lVar13 + 4;
  } while (lVar13 != 0x60);
  pvVar15 = operator_new(0x400);
  lVar13 = 0;
  do {
    puVar1 = (undefined8 *)((long)pvVar15 + lVar13 * 4);
    *puVar1 = 0x98968000989680;
    puVar1[1] = 0x98968000989680;
    lVar13 = lVar13 + 4;
  } while (lVar13 != 0x100);
  calculate_E::updatedH[0x50] = false;
  calculate_E::updatedH[0x51] = false;
  calculate_E::updatedH[0x52] = false;
  calculate_E::updatedH[0x53] = false;
  calculate_E::updatedH[0x54] = false;
  calculate_E::updatedH[0x55] = false;
  calculate_E::updatedH[0x56] = false;
  calculate_E::updatedH[0x57] = false;
  calculate_E::updatedH[0x58] = false;
  calculate_E::updatedH[0x59] = false;
  calculate_E::updatedH[0x5a] = false;
  calculate_E::updatedH[0x5b] = false;
  calculate_E::updatedH[0x5c] = false;
  calculate_E::updatedH[0x5d] = false;
  calculate_E::updatedH[0x5e] = false;
  calculate_E::updatedH[0x5f] = false;
  calculate_E::updatedH[0x40] = false;
  calculate_E::updatedH[0x41] = false;
  calculate_E::updatedH[0x42] = false;
  calculate_E::updatedH[0x43] = false;
  calculate_E::updatedH[0x44] = false;
  calculate_E::updatedH[0x45] = false;
  calculate_E::updatedH[0x46] = false;
  calculate_E::updatedH[0x47] = false;
  calculate_E::updatedH[0x48] = false;
  calculate_E::updatedH[0x49] = false;
  calculate_E::updatedH[0x4a] = false;
  calculate_E::updatedH[0x4b] = false;
  calculate_E::updatedH[0x4c] = false;
  calculate_E::updatedH[0x4d] = false;
  calculate_E::updatedH[0x4e] = false;
  calculate_E::updatedH[0x4f] = false;
  calculate_E::updatedH[0x30] = false;
  calculate_E::updatedH[0x31] = false;
  calculate_E::updatedH[0x32] = false;
  calculate_E::updatedH[0x33] = false;
  calculate_E::updatedH[0x34] = false;
  calculate_E::updatedH[0x35] = false;
  calculate_E::updatedH[0x36] = false;
  calculate_E::updatedH[0x37] = false;
  calculate_E::updatedH[0x38] = false;
  calculate_E::updatedH[0x39] = false;
  calculate_E::updatedH[0x3a] = false;
  calculate_E::updatedH[0x3b] = false;
  calculate_E::updatedH[0x3c] = false;
  calculate_E::updatedH[0x3d] = false;
  calculate_E::updatedH[0x3e] = false;
  calculate_E::updatedH[0x3f] = false;
  calculate_E::updatedH[0x20] = false;
  calculate_E::updatedH[0x21] = false;
  calculate_E::updatedH[0x22] = false;
  calculate_E::updatedH[0x23] = false;
  calculate_E::updatedH[0x24] = false;
  calculate_E::updatedH[0x25] = false;
  calculate_E::updatedH[0x26] = false;
  calculate_E::updatedH[0x27] = false;
  calculate_E::updatedH[0x28] = false;
  calculate_E::updatedH[0x29] = false;
  calculate_E::updatedH[0x2a] = false;
  calculate_E::updatedH[0x2b] = false;
  calculate_E::updatedH[0x2c] = false;
  calculate_E::updatedH[0x2d] = false;
  calculate_E::updatedH[0x2e] = false;
  calculate_E::updatedH[0x2f] = false;
  calculate_E::updatedH[0x10] = false;
  calculate_E::updatedH[0x11] = false;
  calculate_E::updatedH[0x12] = false;
  calculate_E::updatedH[0x13] = false;
  calculate_E::updatedH[0x14] = false;
  calculate_E::updatedH[0x15] = false;
  calculate_E::updatedH[0x16] = false;
  calculate_E::updatedH[0x17] = false;
  calculate_E::updatedH[0x18] = false;
  calculate_E::updatedH[0x19] = false;
  calculate_E::updatedH[0x1a] = false;
  calculate_E::updatedH[0x1b] = false;
  calculate_E::updatedH[0x1c] = false;
  calculate_E::updatedH[0x1d] = false;
  calculate_E::updatedH[0x1e] = false;
  calculate_E::updatedH[0x1f] = false;
  calculate_E::updatedH[0] = false;
  calculate_E::updatedH[1] = false;
  calculate_E::updatedH[2] = false;
  calculate_E::updatedH[3] = false;
  calculate_E::updatedH[4] = false;
  calculate_E::updatedH[5] = false;
  calculate_E::updatedH[6] = false;
  calculate_E::updatedH[7] = false;
  calculate_E::updatedH[8] = false;
  calculate_E::updatedH[9] = false;
  calculate_E::updatedH[10] = false;
  calculate_E::updatedH[0xb] = false;
  calculate_E::updatedH[0xc] = false;
  calculate_E::updatedH[0xd] = false;
  calculate_E::updatedH[0xe] = false;
  calculate_E::updatedH[0xf] = false;
  memset(calculate_E::updatedT,0,0x600);
  if (1 < iVar2) {
    uVar16 = 5;
    if (5 < (int)uVar9) {
      uVar16 = (ulong)uVar9;
    }
    local_168 = 0x1b20b0;
    local_1f8 = 4;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\rE/M -- Completed: ",0x13);
      poVar17 = std::ostream::_M_insert<double>
                          (((double)(int)(uint)local_1f8 / (double)(int)uVar9) * 100.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,"%",1);
      std::ostream::flush();
      uVar11 = this->n - (uint)local_1f8 / 3;
      if (uVar11 != 0 && (int)((uint)local_1f8 / 3) <= this->n) {
        uVar24 = local_1f8 & 0xffffffff;
        uVar31 = 0;
        do {
          iVar2 = (int)uVar31;
          local_160 = local_168;
          lVar13 = 0;
          uVar18 = local_1f8;
          local_1bc = (uint)uVar24;
          do {
            auVar8._8_8_ = 0;
            auVar8._0_8_ = uVar18;
            i = (int)lVar13;
            uVar19 = iVar2 * 3 + (uint)local_1f8 + i;
            uVar22 = (ulong)uVar19 / 3;
            if (uVar19 / 3 != this->n) {
              piVar5 = (this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pa = piVar5[uVar31];
              a = (int)uVar22;
              pb = piVar5[uVar22];
              lVar28 = (long)pb;
              pna = piVar5[uVar31 + 1];
              ppb = piVar5[uVar22 - 1];
              uVar19 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[pa];
              uVar3 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar28];
              n_codon_an = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[pna];
              n_codon_bp = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[ppb];
              la = sigma(iVar2,i);
              i_00 = (i + (uint)local_1f8) % 3;
              lb = sigma(a,i_00);
              calculate_E::updatedH[0x50] = false;
              calculate_E::updatedH[0x51] = false;
              calculate_E::updatedH[0x52] = false;
              calculate_E::updatedH[0x53] = false;
              calculate_E::updatedH[0x54] = false;
              calculate_E::updatedH[0x55] = false;
              calculate_E::updatedH[0x56] = false;
              calculate_E::updatedH[0x57] = false;
              calculate_E::updatedH[0x58] = false;
              calculate_E::updatedH[0x59] = false;
              calculate_E::updatedH[0x5a] = false;
              calculate_E::updatedH[0x5b] = false;
              calculate_E::updatedH[0x5c] = false;
              calculate_E::updatedH[0x5d] = false;
              calculate_E::updatedH[0x5e] = false;
              calculate_E::updatedH[0x5f] = false;
              calculate_E::updatedH[0x40] = false;
              calculate_E::updatedH[0x41] = false;
              calculate_E::updatedH[0x42] = false;
              calculate_E::updatedH[0x43] = false;
              calculate_E::updatedH[0x44] = false;
              calculate_E::updatedH[0x45] = false;
              calculate_E::updatedH[0x46] = false;
              calculate_E::updatedH[0x47] = false;
              calculate_E::updatedH[0x48] = false;
              calculate_E::updatedH[0x49] = false;
              calculate_E::updatedH[0x4a] = false;
              calculate_E::updatedH[0x4b] = false;
              calculate_E::updatedH[0x4c] = false;
              calculate_E::updatedH[0x4d] = false;
              calculate_E::updatedH[0x4e] = false;
              calculate_E::updatedH[0x4f] = false;
              calculate_E::updatedH[0x30] = false;
              calculate_E::updatedH[0x31] = false;
              calculate_E::updatedH[0x32] = false;
              calculate_E::updatedH[0x33] = false;
              calculate_E::updatedH[0x34] = false;
              calculate_E::updatedH[0x35] = false;
              calculate_E::updatedH[0x36] = false;
              calculate_E::updatedH[0x37] = false;
              calculate_E::updatedH[0x38] = false;
              calculate_E::updatedH[0x39] = false;
              calculate_E::updatedH[0x3a] = false;
              calculate_E::updatedH[0x3b] = false;
              calculate_E::updatedH[0x3c] = false;
              calculate_E::updatedH[0x3d] = false;
              calculate_E::updatedH[0x3e] = false;
              calculate_E::updatedH[0x3f] = false;
              calculate_E::updatedH[0x20] = false;
              calculate_E::updatedH[0x21] = false;
              calculate_E::updatedH[0x22] = false;
              calculate_E::updatedH[0x23] = false;
              calculate_E::updatedH[0x24] = false;
              calculate_E::updatedH[0x25] = false;
              calculate_E::updatedH[0x26] = false;
              calculate_E::updatedH[0x27] = false;
              calculate_E::updatedH[0x28] = false;
              calculate_E::updatedH[0x29] = false;
              calculate_E::updatedH[0x2a] = false;
              calculate_E::updatedH[0x2b] = false;
              calculate_E::updatedH[0x2c] = false;
              calculate_E::updatedH[0x2d] = false;
              calculate_E::updatedH[0x2e] = false;
              calculate_E::updatedH[0x2f] = false;
              calculate_E::updatedH[0x10] = false;
              calculate_E::updatedH[0x11] = false;
              calculate_E::updatedH[0x12] = false;
              calculate_E::updatedH[0x13] = false;
              calculate_E::updatedH[0x14] = false;
              calculate_E::updatedH[0x15] = false;
              calculate_E::updatedH[0x16] = false;
              calculate_E::updatedH[0x17] = false;
              calculate_E::updatedH[0x18] = false;
              calculate_E::updatedH[0x19] = false;
              calculate_E::updatedH[0x1a] = false;
              calculate_E::updatedH[0x1b] = false;
              calculate_E::updatedH[0x1c] = false;
              calculate_E::updatedH[0x1d] = false;
              calculate_E::updatedH[0x1e] = false;
              calculate_E::updatedH[0x1f] = false;
              calculate_E::updatedH[0] = false;
              calculate_E::updatedH[1] = false;
              calculate_E::updatedH[2] = false;
              calculate_E::updatedH[3] = false;
              calculate_E::updatedH[4] = false;
              calculate_E::updatedH[5] = false;
              calculate_E::updatedH[6] = false;
              calculate_E::updatedH[7] = false;
              calculate_E::updatedH[8] = false;
              calculate_E::updatedH[9] = false;
              calculate_E::updatedH[10] = false;
              calculate_E::updatedH[0xb] = false;
              calculate_E::updatedH[0xc] = false;
              calculate_E::updatedH[0xd] = false;
              calculate_E::updatedH[0xe] = false;
              calculate_E::updatedH[0xf] = false;
              memset(calculate_E::updatedT,0,0x600);
              if (0 < (int)uVar19) {
                l = lb - la;
                iVar20 = i * 3 + i_00;
                local_200 = 0;
                do {
                  if (0 < (int)uVar3) {
                    lVar25 = 0;
                    y = 0;
                    do {
                      iVar23 = 0;
                      iVar27 = 0;
                      iVar21 = 0;
                      if (lVar13 == 0) {
                        iVar27 = nucleotides[pa][local_200][1];
                        iVar21 = nucleotides[pa][local_200][2] << 4;
                      }
                      iVar26 = 0;
                      if (i_00 == 2) {
                        iVar26 = *(int *)(lVar28 * 0x48 + 0x1b20a4 + lVar25);
                        iVar23 = *(int *)((long)nucleotides[lVar28][0] + lVar25) << 2;
                      }
                      if (lVar13 == 1) {
                        iVar27 = nucleotides[pa][local_200][2];
                      }
                      if (i_00 == 1) {
                        iVar26 = *(int *)((long)nucleotides[lVar28][0] + lVar25);
                      }
                      xi = nucleotides[pa][local_200][lVar13];
                      yj = *(int *)(lVar28 * 0x48 +
                                    (SUB168(auVar8 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 &
                                    0xfffffffffffffffcU) * -3 + local_160 + lVar25);
                      iVar4 = *(int *)((long)xi * 0x14 + 0x1b14b8 + (long)yj * 4);
                      x = (int)local_200;
                      if (iVar4 == 0) {
                        calculate_M(this,iVar2,a,i,i_00,x,y);
                      }
                      else {
                        lVar30 = (long)(iVar21 + iVar23 + iVar4 * 0x100 + iVar27 * 0x40 + -0x100) +
                                 (long)iVar26;
                        if (calculate_E::updatedT[lVar30] == false) {
                          iVar21 = (this->ava_nucle_p).super__Vector_base<int,_std::allocator<int>_>
                                   ._M_impl.super__Vector_impl_data._M_start
                                   [lVar13 + uVar31 * 0x12 + local_200 * 3];
                          iVar23 = *(int *)((long)(this->ava_nucle_m).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start +
                                           lVar25 + (ulong)((int)uVar18 + (local_1bc / 3) * 0x12 +
                                                           (int)((uVar18 & 0xffffffff) / 3) * -3) *
                                                    4);
                          if (l < 8) {
                            iVar27 = hairpin(this,la,lb,l,pa,pb,pna,ppb,n_codon_an,n_codon_bp,xi,yj,
                                             i,i_00,x,y,iVar21,iVar23);
                            if (9999999 < iVar27) {
                              iVar27 = 10000000;
                            }
                          }
                          else {
                            lVar29 = (long)(iVar4 * 0x10 + iVar27 * 4 + -0x10) + (long)iVar26;
                            if (calculate_E::updatedH[lVar29] == true) {
                              iVar27 = *(int *)((long)pvVar14 + lVar29 * 4);
                            }
                            else {
                              iVar27 = hairpin(this,la,lb,l,xi,yj,iVar21,iVar23);
                              *(int *)((long)pvVar14 + lVar29 * 4) = iVar27;
                              calculate_E::updatedH[lVar29] = true;
                            }
                            if (9999999 < iVar27) {
                              iVar27 = 10000000;
                            }
                          }
                          iVar23 = internal(this,iVar2,a,i,i_00,x,y,la,lb,xi,yj,iVar21,iVar23);
                          iVar21 = -(uint)(iVar27 < 10000000);
                          if (iVar23 < iVar27) {
                            iVar27 = this->n * iVar2 + a;
                            iVar21 = (this->EB).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start
                                     [(this->start_index).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start[iVar27] + y +
                                      (this->index_offset).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start[iVar27] * iVar20 +
                                      n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start
                                      [(this->protein).super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar22]] * x];
                            iVar27 = iVar23;
                          }
                          iVar23 = multi_loop(this,iVar2,a,i,i_00,x,y,pa,pb,n_codon_an,n_codon_bp);
                          if (iVar27 <= iVar23) {
                            iVar23 = iVar27;
                          }
                          iVar26 = -3;
                          if (iVar27 <= iVar23) {
                            iVar26 = iVar21;
                          }
                          *(int *)((long)pvVar12 + lVar30 * 4) = iVar23;
                          *(int *)((long)__s + lVar30 * 4) = iVar26;
                          calculate_E::updatedT[lVar30] = true;
                        }
                        else {
                          iVar26 = *(int *)((long)__s + lVar30 * 4);
                          iVar23 = *(int *)((long)pvVar12 + lVar30 * 4);
                        }
                        piVar10 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                        iVar27 = this->n * iVar2 + a;
                        piVar5 = (this->start_index).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
                        piVar6 = (this->index_offset).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
                        piVar7 = (this->protein).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
                        (this->E).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [piVar5[iVar27] + y + piVar6[iVar27] * iVar20 +
                         n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[piVar7[uVar22]] * x] = iVar23;
                        iVar27 = this->n * iVar2 + a;
                        (this->EB).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [piVar5[iVar27] + y + piVar6[iVar27] * iVar20 + piVar10[piVar7[uVar22]] * x]
                             = iVar26;
                        calculate_M(this,iVar2,a,i,i_00,x,y);
                      }
                      y = y + 1;
                      lVar25 = lVar25 + 0xc;
                    } while ((ulong)uVar3 * 0xc != lVar25);
                  }
                  local_200 = local_200 + 1;
                } while (local_200 != uVar19);
              }
            }
            lVar13 = lVar13 + 1;
            uVar18 = uVar18 + 1;
            local_1bc = local_1bc + 1;
            local_160 = local_160 + 4;
          } while (lVar13 != 3);
          uVar31 = uVar31 + 1;
          uVar24 = (ulong)((uint)uVar24 + 3);
        } while (uVar31 < uVar11);
      }
      local_1f8 = local_1f8 + 1;
      local_168 = local_168 + 4;
    } while (local_1f8 != uVar16);
  }
  operator_delete(pvVar15);
  operator_delete(pvVar14);
  operator_delete(__s);
  operator_delete(pvVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dn._M_dataplus._M_p != &dn.field_2) {
    operator_delete(dn._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cp._M_dataplus._M_p != &cp.field_2) {
    operator_delete(cp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)bp._M_dataplus._M_p != &bp.field_2) {
    operator_delete(bp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)an._M_dataplus._M_p != &an.field_2) {
    operator_delete(an._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Zuker::calculate_E() {
    int min_energy = inf, energy = inf;
    int t;
    string an,bp,cp,dn;

    int nuc_len = 3*n;
    vector<int> T(1536,inf);
    vector<int> T1(1536,0);
    vector<int> H(96,inf);
    vector<int> MT(256, inf);

    static bool updatedT[1536];
    static bool updatedH[96];
    static bool updatedM[256];

    memset(updatedH, false, 96);
    memset(updatedM, false, 256);
    memset(updatedT, false, 1536);


    for (int len = 4; len < nuc_len; ++len) {
        std::cout << "\rE/M -- Completed: " << (len*1.0/nuc_len) * 100 << "%" << std::flush;

        int max_a = n - (int)floor(len/3);
        for (int a = 0; a < max_a; ++a) {
            for (int i = 0; i < 3; ++i) {

                int j = (i+len) % 3;
                int b = (3*a+i+len) / 3;

                if (b == n) continue;
                int pa = protein[a];
                int pb = protein[b];
                int pna = protein[a + 1];
                int ppb = protein[b - 1];
                const int n_codon_a = n_codon[pa];
                const int n_codon_b = n_codon[pb];
                const int n_codon_an = n_codon[pna];
                const int n_codon_bp = n_codon[ppb];
                int la = sigma(a,i);
                int lb = sigma(b,j);
                int l = lb - la;

                // set updatedT to false for each entry
                // set updatedH to false for each entry
                // memset
                memset(updatedH, false, 96);
                memset(updatedM, false, 256);
                memset(updatedT, false, 1536); //4096

                for (int x = 0; x < n_codon_a; x++) {
                    for (int y = 0; y < n_codon_b; y++) {
                        int xi = nucleotides[pa][x][i];
                        int yj = nucleotides[pb][y][j];

                        int type = BP_pair[xi+1][yj+1];

                        int xi_ = 0,xi2_ = 0, _2yj = 0, _yj = 0;
                        if (i == 0) {
                            xi_ = nucleotides[pa][x][i+1];
                            xi2_ = nucleotides[pa][x][i+2];
                        }
                        if (j == 2) {
                            _yj = nucleotides[pb][y][j-1];
                            _2yj = nucleotides[pb][y][j-2];
                        }
                        if (i == 1) {
                            xi_ = nucleotides[pa][x][i+1];
                        }
                        if (j == 1) {
                            _yj = nucleotides[pb][y][j-1];
                        }

                        // ends not paired
                        if (!type) {
                            calculate_M(a,b,i,j,x,y);
                            continue;
                        }

                        min_energy = inf, energy = inf, t = 0;


                        int an_int = ava_nucle_p[index(a,x,i)];
                        int bp_int = ava_nucle_m[index(b,y,j)];


                        int idx1 = T_index(type, xi_,xi2_,_2yj, _yj); //
                        if (!updatedT[idx1]) {
                            // hairpin
                            if (l + 1 > 8) {
                                int idx = H_index(type, xi_, _yj); //
                                if (!updatedH[idx]) {
                                    H[idx] = hairpin(la, lb, l, xi, yj, an_int, bp_int);
                                    updatedH[idx] = true;
                                }
                                min_energy = min(min_energy, H[idx]);
                            }
                            else {
                                min_energy = min(min_energy, hairpin(la, lb, l, pa, pb, pna, ppb, n_codon_an, n_codon_bp, xi, yj, i, j, x, y, an_int, bp_int));
                            }
                            if (energy > min_energy) {
                                energy = min_energy;
                                t = -1;
                            }
                            // interior: stacking + bulge + internal;
                            min_energy = min(min_energy, internal(a, b, i, j, x, y, la, lb, xi, yj, an_int, bp_int));
                            if (energy > min_energy) {
                                energy = min_energy;
                                t = EB[index(a,b,i,j,x,y)];
                            }
                            // multiloop
                            min_energy = min(min_energy, multi_loop(a, b, i, j, x, y, pa, pb, n_codon_an, n_codon_bp));
                            if (energy > min_energy) {
                                energy = min_energy;
                                t = -3;
                            }
                            T[idx1] = min_energy;
                            T1[idx1] = t;
                            updatedT[idx1] = true;
                        } else {
                            t = T1[idx1];
                        }
                        min_energy = T[idx1];

                        Access_E(a,b,i,j,x,y) =  min_energy;

                        Access_EB(a,b,i,j,x,y) = t;
                        calculate_M(a,b,i,j,x,y);

                    }
                }
            }
        }

    }

}